

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

char * luaJIT_profile_dumpstack(lua_State *L,char *fmt,int depth,size_t *len)

{
  SBuf *sb;
  ProfileState *ps;
  size_t *len_local;
  int depth_local;
  char *fmt_local;
  lua_State *L_local;
  
  profile_state.sb.w = profile_state.sb.b;
  profile_state.sb.L.ptr64 = (uint64_t)L;
  lj_debug_dumpstack(L,&profile_state.sb,fmt,depth);
  *len = (ulong)(uint)((int)profile_state.sb.w - (int)profile_state.sb.b);
  return profile_state.sb.b;
}

Assistant:

LUA_API const char *luaJIT_profile_dumpstack(lua_State *L, const char *fmt,
					     int depth, size_t *len)
{
  ProfileState *ps = &profile_state;
  SBuf *sb = &ps->sb;
  setsbufL(sb, L);
  lj_buf_reset(sb);
  lj_debug_dumpstack(L, sb, fmt, depth);
  *len = (size_t)sbuflen(sb);
  return sb->b;
}